

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void checknext(LexState *ls,int c)

{
  undefined4 in_ESI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  check((LexState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  luaX_next((LexState *)0x1153b5);
  return;
}

Assistant:

static void checknext(LexState*ls,int c){
check(ls,c);
luaX_next(ls);
}